

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voc.c
# Opt level: O2

void voc_count(voccxdef *ctx,objnum objn,prpnum prp,int *cnt,int *siz)

{
  voc_count_ctx fnctx;
  undefined8 local_1c;
  prpnum local_14;
  
  local_1c = 0;
  local_14 = prp;
  voc_iterate(ctx,objn,voc_count_cb,&local_1c);
  if (cnt != (int *)0x0) {
    *cnt = (int)local_1c;
  }
  if (siz != (int *)0x0) {
    *siz = local_1c._4_4_;
  }
  return;
}

Assistant:

void voc_count(voccxdef *ctx, objnum objn, prpnum prp, int *cnt, int *siz)
{
    struct voc_count_ctx fnctx;

    /* set up the context with zero initial counts */
    fnctx.cnt = 0;
    fnctx.siz = 0;
    fnctx.prp = prp;

    /* iterate over all words for the object with our callback */
    voc_iterate(ctx, objn, voc_count_cb, &fnctx);

    /* return the data */
    if (cnt) *cnt = fnctx.cnt;
    if (siz) *siz = fnctx.siz;
}